

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O3

void luaE_freethread(lua_State *L,lua_State *L1)

{
  long lVar1;
  long lVar2;
  
  luaF_close(L1,L1->stack,-1);
  if (L1->openupval != (UpVal *)0x0) {
    __assert_fail("L1->openupval == ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                  ,0x13e,"void luaE_freethread(lua_State *, lua_State *)");
  }
  lVar1._0_1_ = L[-1].hookmask;
  lVar1._1_1_ = L[-1].allowhook;
  lVar1._2_2_ = L[-1].nci;
  lVar1._4_1_ = L[-1].magic;
  lVar1._5_3_ = *(undefined3 *)&L[-1].field_0xcd;
  lVar2._0_1_ = L1[-1].hookmask;
  lVar2._1_1_ = L1[-1].allowhook;
  lVar2._2_2_ = L1[-1].nci;
  lVar2._4_1_ = L1[-1].magic;
  lVar2._5_3_ = *(undefined3 *)&L1[-1].field_0xcd;
  if (lVar1 == lVar2) {
    freestack(L1);
    luaM_realloc_(L,&L1[-1].hookcount,0xe0,0);
    return;
  }
  __assert_fail("((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock == ((struct L_EXTRA*)(((void *)((char *)(L1) - sizeof(struct L_EXTRA)))))->plock"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstate.c"
                ,0x13f,"void luaE_freethread(lua_State *, lua_State *)");
}

Assistant:

void luaE_freethread (lua_State *L, lua_State *L1) {
  LX *l = fromstate(L1);
#ifdef RAVI_DEFER_STATEMENT
  luaF_close(L1, L1->stack, NOCLOSINGMETH);  /* close all upvalues for this thread */
#else
  luaF_close(L1, L1->stack);  /* close all upvalues for this thread */
#endif
  lua_assert(L1->openupval == NULL);
  luai_userstatefree(L, L1);
  freestack(L1);
  luaM_free(L, l);
}